

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

int __thiscall
QEasingCurveFunction::copy(QEasingCurveFunction *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *amplitude;
  QEasingCurveFunction *rv;
  QList<TCBPoint> *in_stack_ffffffffffffffc8;
  qreal in_stack_ffffffffffffffe0;
  Type in_stack_ffffffffffffffec;
  int iVar1;
  QEasingCurveFunction *in_stack_fffffffffffffff0;
  
  amplitude = operator_new(0x58);
  QEasingCurveFunction
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
             (qreal)amplitude,(qreal)this);
  iVar1 = (int)amplitude;
  QList<QPointF>::operator=((QList<QPointF> *)this,(QList<QPointF> *)in_stack_ffffffffffffffc8);
  QList<TCBPoint>::operator=((QList<TCBPoint> *)this,in_stack_ffffffffffffffc8);
  return iVar1;
}

Assistant:

QEasingCurveFunction *QEasingCurveFunction::copy() const
{
    QEasingCurveFunction *rv = new QEasingCurveFunction(_t, _p, _a, _o);
    rv->_bezierCurves = _bezierCurves;
    rv->_tcbPoints = _tcbPoints;
    return rv;
}